

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O1

Vector2f __thiscall Rml::ElementHandleTargetData::DistanceToTopLeft(ElementHandleTargetData *this)

{
  Vector2f VVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar2 = Element::GetOffsetLeft(this->target);
  fVar3 = Box::GetEdge(this->parent_box,Border,Left);
  fVar4 = Element::GetOffsetTop(this->target);
  fVar5 = Box::GetEdge(this->parent_box,Border,Top);
  VVar1.y = fVar4 - fVar5;
  VVar1.x = fVar2 - fVar3;
  return VVar1;
}

Assistant:

Vector2f DistanceToTopLeft() const
	{
		return {target->GetOffsetLeft() - parent_box.GetEdge(BoxArea::Border, BoxEdge::Left),
			target->GetOffsetTop() - parent_box.GetEdge(BoxArea::Border, BoxEdge::Top)};
	}